

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  u8 *puVar5;
  bool bVar6;
  ushort uVar7;
  u16 uVar8;
  int iVar9;
  uint uVar10;
  ushort uVar11;
  ushort uVar12;
  uint uVar13;
  ushort *puVar14;
  uint uVar15;
  uint uVar16;
  uint unaff_EBP;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  u8 *local_70;
  u8 *local_50;
  
  puVar5 = pPage->aData;
  uVar18 = (ulong)pPage->hdrOffset;
  uVar1 = pPage->cellOffset;
  uVar2 = pPage->nCell;
  uVar15 = (uint)uVar1 + (uint)uVar2 * 2;
  uVar4 = pPage->pBt->usableSize;
  if ((int)(uint)puVar5[uVar18 + 7] <= nMaxFrag) {
    uVar11 = *(ushort *)(puVar5 + uVar18 + 1) << 8 | *(ushort *)(puVar5 + uVar18 + 1) >> 8;
    iVar9 = 0;
    if (uVar11 != 0) {
      uVar12 = *(ushort *)(puVar5 + uVar11) << 8 | *(ushort *)(puVar5 + uVar11) >> 8;
      if ((uVar12 == 0) ||
         ((puVar5[uVar12] == '\0' && (iVar9 = 0, puVar5[(ulong)uVar12 + 1] == '\0')))) {
        uVar7 = *(ushort *)(puVar5 + (ulong)uVar11 + 2) << 8 |
                *(ushort *)(puVar5 + (ulong)uVar11 + 2) >> 8;
        uVar3 = *(ushort *)(puVar5 + uVar18 + 5);
        uVar13 = (uint)uVar7;
        uVar16 = (uint)uVar12;
        if (uVar16 == 0) {
          uVar17 = 0;
        }
        else {
          uVar13 = (uint)uVar7 + (uint)uVar11;
          if (uVar16 < uVar13) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xee17,
                        "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
            iVar9 = 1;
            goto LAB_00143b64;
          }
          uVar17 = (uint)(ushort)(*(ushort *)(puVar5 + (ulong)uVar12 + 2) << 8 |
                                 *(ushort *)(puVar5 + (ulong)uVar12 + 2) >> 8);
          memmove(puVar5 + (uVar13 + uVar17),puVar5 + uVar13,(long)(int)(uVar16 - uVar13));
          uVar13 = uVar7 + uVar17;
        }
        uVar10 = (uint)(ushort)(uVar3 << 8 | uVar3 >> 8);
        unaff_EBP = uVar13 + uVar10;
        memmove(puVar5 + unaff_EBP,puVar5 + uVar10,(long)(int)(uVar11 - uVar10));
        iVar9 = 5;
        if (uVar1 < uVar15) {
          puVar14 = (ushort *)(puVar5 + uVar1);
          do {
            uVar12 = *puVar14 << 8 | *puVar14 >> 8;
            uVar10 = uVar13;
            if (((uint)uVar12 < (uint)uVar11) || (uVar10 = uVar17, uVar12 < uVar16)) {
              uVar12 = uVar12 + (short)uVar10;
              *puVar14 = uVar12 * 0x100 | uVar12 >> 8;
            }
            puVar14 = puVar14 + 1;
          } while (puVar14 < puVar5 + uVar15);
        }
      }
    }
LAB_00143b64:
    if (iVar9 == 5) goto LAB_00143d3f;
    if (iVar9 != 0) {
      return 0xb;
    }
  }
  unaff_EBP = uVar4;
  if ((ulong)uVar2 != 0) {
    uVar19 = 0;
    local_50 = (u8 *)0x0;
    local_70 = puVar5;
    do {
      uVar11 = *(ushort *)(puVar5 + uVar19 * 2 + (ulong)uVar1) << 8 |
               *(ushort *)(puVar5 + uVar19 * 2 + (ulong)uVar1) >> 8;
      if ((uVar11 < uVar15) ||
         (uVar13 = (uint)uVar11, uVar13 != uVar4 - 4 && (int)(uVar4 - 4) <= (int)(uint)uVar11)) {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xee36,
                    "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
        bVar6 = true;
      }
      else {
        uVar8 = (*pPage->xCellSize)(pPage,local_70 + uVar13);
        uVar16 = unaff_EBP - uVar8;
        if (((int)uVar16 < (int)uVar15) || ((int)uVar4 < (int)((uint)uVar11 + (uint)uVar8))) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xee3c,
                      "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
          bVar6 = true;
          unaff_EBP = uVar16;
        }
        else {
          *(ushort *)(puVar5 + uVar19 * 2 + (ulong)uVar1) =
               (ushort)uVar16 << 8 | (ushort)uVar16 >> 8;
          if (local_50 == (u8 *)0x0) {
            if (uVar16 == uVar13) {
              bVar6 = false;
              local_50 = (u8 *)0x0;
              unaff_EBP = uVar16;
              goto LAB_00143d13;
            }
            local_70 = (u8 *)pPage->pBt->pPager->pTmpSpace;
            uVar11 = *(ushort *)(puVar5 + uVar18 + 5) << 8 | *(ushort *)(puVar5 + uVar18 + 5) >> 8;
            memcpy(local_70 + uVar11,puVar5 + uVar11,(long)(int)(unaff_EBP - uVar11));
            local_50 = local_70;
          }
          memcpy(puVar5 + uVar16,local_70 + uVar13,(ulong)uVar8);
          bVar6 = false;
          unaff_EBP = uVar16;
        }
      }
LAB_00143d13:
      if (bVar6) {
        return 0xb;
      }
      uVar19 = uVar19 + 1;
    } while (uVar2 != uVar19);
  }
  puVar5[uVar18 + 7] = '\0';
LAB_00143d3f:
  if ((uint)puVar5[uVar18 + 7] + (unaff_EBP - uVar15) == (uint)pPage->nFree) {
    *(ushort *)(puVar5 + uVar18 + 5) = (ushort)unaff_EBP << 8 | (ushort)unaff_EBP >> 8;
    (puVar5 + uVar18 + 1)[0] = '\0';
    (puVar5 + uVar18 + 1)[1] = '\0';
    iVar9 = 0;
    memset(puVar5 + uVar15,0,(long)(int)(unaff_EBP - uVar15));
  }
  else {
    iVar9 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xee50,
                "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
  }
  return iVar9;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to 
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);

      /* pageFindSlot() has already verified that free blocks are sorted
      ** in order of offset within the page, and that no block extends
      ** past the end of the page. Provided the two free slots do not 
      ** overlap, this guarantees that the memmove() calls below will not
      ** overwrite the usableSize byte buffer, even if the database page
      ** is corrupt.  */
      assert( iFree2==0 || iFree2>iFree );
      assert( iFree+get2byte(&data[iFree+2]) <= usableSize );
      assert( iFree2==0 || iFree2+get2byte(&data[iFree2+2]) <= usableSize );

      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
          sz2 = get2byte(&data[iFree2+2]);
          assert( iFree+sz+sz2+iFree2-(iFree+sz) <= usableSize );
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }
        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    /* These conditions have already been verified in btreeInitPage()
    ** if PRAGMA cell_size_check=ON.
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_PGNO(pPage->pgno);
    }
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = pPage->xCellSize(pPage, &src[pc]);
    cbrk -= size;
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_PGNO(pPage->pgno);
    }
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      int x;
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      x = get2byte(&data[hdr+5]);
      memcpy(&temp[x], &data[x], (cbrk+size) - x);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  data[hdr+7] = 0;

 defragment_out:
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PGNO(pPage->pgno);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}